

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_chart_type nVar1;
  int iVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_vec2 nVar5;
  int iVar6;
  uint uVar7;
  nk_command_buffer *b;
  nk_flags nVar8;
  uint uVar9;
  nk_color nVar10;
  int *piVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5dd3,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5dd4,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  if (3 < (uint)slot) {
    __assert_fail("slot >= 0 && slot < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5dd5,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar4 = pnVar3->layout;
  if (slot < (pnVar4->chart).slot) {
    nVar1 = (pnVar4->chart).slots[(uint)slot].type;
    if (nVar1 == NK_CHART_COLUMN) {
      iVar6 = (pnVar4->chart).slots[(uint)slot].count;
      iVar2 = (pnVar4->chart).slots[(uint)slot].index;
      if (iVar6 <= iVar2) {
        return 0;
      }
      if (iVar6 == 0) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = ((pnVar4->chart).w - (float)(iVar6 + -1)) / (float)iVar6;
      }
      fVar16 = (pnVar4->chart).h;
      fVar14 = (pnVar4->chart).slots[(uint)slot].range;
      fVar13 = value / fVar14;
      fVar15 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar15 = fVar13;
      }
      fVar15 = fVar15 * fVar16;
      if (0.0 <= value) {
        fVar13 = (pnVar4->chart).slots[(uint)slot].min;
        fVar17 = -fVar13;
        if (-fVar13 <= fVar13) {
          fVar17 = fVar13;
        }
        fVar13 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar13 = fVar14;
        }
        fVar16 = ((pnVar4->chart).y + fVar16) - ((fVar17 + value) / fVar13) * fVar16;
      }
      else {
        fVar14 = (value - (pnVar4->chart).slots[(uint)slot].max) / fVar14;
        fVar13 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar13 = fVar14;
        }
        fVar16 = (fVar16 * fVar13 + (pnVar4->chart).y) - fVar15;
      }
      fVar14 = (float)iVar2;
      nVar10 = (pnVar4->chart).slots[(uint)slot].color;
      rect_02.h = fVar15;
      rect_02.w = fVar12;
      fVar14 = fVar14 * fVar12 + (pnVar4->chart).x + fVar14;
      nVar8 = 0;
      if (((((pnVar4->flags & 0x1000) == 0) && (fVar13 = (ctx->input).mouse.pos.x, fVar14 <= fVar13)
           ) && (fVar13 < fVar12 + fVar14)) &&
         ((fVar12 = (ctx->input).mouse.pos.y, nVar8 = 0, fVar16 <= fVar12 &&
          (fVar12 < fVar15 + fVar16)))) {
        if ((ctx->input).mouse.buttons[0].down == 0) {
          nVar8 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
        }
        else {
          nVar8 = 1;
        }
        nVar10 = (pnVar4->chart).slots[(uint)slot].highlight;
      }
      rect_02.y = fVar16;
      rect_02.x = fVar14;
      nk_fill_rect(&pnVar3->buffer,rect_02,0.0,nVar10);
    }
    else {
      if (nVar1 != NK_CHART_LINES) {
        return 0;
      }
      b = &pnVar3->buffer;
      fVar12 = (pnVar4->chart).slots[(uint)slot].min;
      fVar12 = (value - fVar12) / ((pnVar4->chart).slots[(uint)slot].max - fVar12);
      iVar6 = (pnVar4->chart).slots[(uint)slot].index;
      if (iVar6 == 0) {
        fVar16 = (pnVar4->chart).x;
        (pnVar4->chart).slots[(uint)slot].last.x = fVar16;
        fVar14 = (pnVar4->chart).h;
        fVar12 = ((pnVar4->chart).y + fVar14) - fVar12 * fVar14;
        (pnVar4->chart).slots[(uint)slot].last.y = fVar12;
        rect_00.x = fVar16 + -2.0;
        rect_00.y = fVar12 + -2.0;
        nVar10 = (pnVar4->chart).slots[(uint)slot].color;
        nVar8 = 0;
        if ((pnVar4->flags & 0x1000) == 0) {
          fVar14 = (ctx->input).mouse.pos.x;
          if ((fVar16 + -3.0 <= fVar14) && (fVar14 < fVar16 + -3.0 + 6.0)) {
            fVar16 = (ctx->input).mouse.pos.y;
            nVar8 = 0;
            if ((fVar12 + -3.0 <= fVar16) && (fVar16 < fVar12 + -3.0 + 6.0)) {
              rect_00.w = 4.0;
              rect_00.h = 4.0;
              uVar7 = nk_input_is_mouse_hovering_rect(&ctx->input,rect_00);
              if ((ctx->input).mouse.buttons[0].down == 0) {
                uVar9 = 0;
              }
              else {
                uVar9 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2;
              }
              nVar8 = uVar9 | uVar7;
              nVar10 = (pnVar4->chart).slots[(uint)slot].highlight;
            }
          }
        }
        rect_03.y = rect_00.y;
        rect_03.x = rect_00.x;
        rect_03.w = 4.0;
        rect_03.h = 4.0;
        nk_fill_rect(b,rect_03,0.0,nVar10);
      }
      else {
        nVar10 = (pnVar4->chart).slots[(uint)slot].color;
        fVar16 = (pnVar4->chart).h;
        fVar14 = (pnVar4->chart).x +
                 (float)iVar6 * ((pnVar4->chart).w / (float)(pnVar4->chart).slots[(uint)slot].count)
        ;
        fVar12 = (pnVar4->chart).y + fVar16 + fVar16 * -fVar12;
        nk_stroke_line(b,(pnVar4->chart).slots[(uint)slot].last.x,
                       (pnVar4->chart).slots[(uint)slot].last.y,fVar14,fVar12,1.0,nVar10);
        nVar8 = 0;
        if (((pnVar4->flags & 0x1000) == 0) &&
           (rect.x = fVar14 + -3.0, rect.y = fVar12 + -3.0, rect.w = 6.0, rect.h = 6.0,
           iVar6 = nk_input_is_mouse_hovering_rect(&ctx->input,rect), iVar6 != 0)) {
          if ((ctx->input).mouse.buttons[0].down == 0) {
            nVar8 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
          }
          else {
            nVar8 = 1;
          }
          nVar10 = (pnVar4->chart).slots[(uint)slot].highlight;
        }
        rect_01.x = fVar14 + -2.0;
        rect_01.y = fVar12 + -2.0;
        rect_01.w = 4.0;
        rect_01.h = 4.0;
        nk_fill_rect(b,rect_01,0.0,nVar10);
        nVar5.y = fVar12;
        nVar5.x = fVar14;
        (pnVar4->chart).slots[(uint)slot].last = nVar5;
      }
    }
    piVar11 = &(pnVar4->chart).slots[(uint)slot].index;
    *piVar11 = *piVar11 + 1;
    return nVar8;
  }
  __assert_fail("slot < ctx->current->layout->chart.slot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x5dd6,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
    nk_flags flags;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    NK_ASSERT(slot < ctx->current->layout->chart.slot);
    if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
    if (slot >= ctx->current->layout->chart.slot) return nk_false;

    win = ctx->current;
    if (win->layout->chart.slot < slot) return nk_false;
    switch (win->layout->chart.slots[slot].type) {
    case NK_CHART_LINES:
        flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
    case NK_CHART_COLUMN:
        flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
    default:
    case NK_CHART_MAX:
        flags = 0;
    }
    return flags;
}